

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O2

int __thiscall tiger::trains::network::TCPSocket::init(TCPSocket *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  
  iVar1 = socket(2,1,0);
  this->pSocket = iVar1;
  return CONCAT31((int3)((uint)iVar1 >> 8),iVar1 != -1);
}

Assistant:

bool TCPSocket::init()
{
#if defined(linux) || defined(__linux) || defined(__linux__)

#else
    WSADATA ws;
    WSAStartup(MAKEWORD(2, 2), &ws);
#endif

    pSocket = socket(AF_INET, SOCK_STREAM, 0);

    return isSocketValid();
}